

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
* __thiscall
Lib::
concatIters<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>
          (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
           *__return_storage_ptr__,Lib *this,
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
          i1,VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
             i2)

{
  int *piVar1;
  Lib *pLVar2;
  int iVar3;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
  *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  *extraout_RDX;
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  *extraout_RDX_00;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  i;
  Lib local_30 [8];
  Lib *local_28;
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  *local_20;
  
  if (this != (Lib *)0x0) {
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
  }
  i._core = i1._core;
  if (i1._core !=
      (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
       *)0x0) {
    iVar3 = (i1._core)->_refCnt + 3;
    (i1._core)->_refCnt = iVar3;
    if (iVar3 == 0) {
      (*(i1._core)->_vptr_IteratorCore[1])(i1._core);
      iVar3 = (i1._core)->_refCnt;
      i._core = (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
                 *)extraout_RDX;
    }
    (i1._core)->_refCnt = iVar3 + -1;
    if (iVar3 + -1 == 0) {
      (*(i1._core)->_vptr_IteratorCore[1])(i1._core);
      i._core = (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
                 *)extraout_RDX_00;
    }
  }
  local_30[0] = (Lib)0x1;
  if (this != (Lib *)0x0) {
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
  }
  if (i1._core !=
      (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
       *)0x0) {
    (i1._core)->_refCnt = (i1._core)->_refCnt + 1;
  }
  local_28 = this;
  local_20 = i1._core;
  pIVar4 = iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>
                     (__return_storage_ptr__,local_30,
                      (CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
                       *)i._core);
  if (local_20 !=
      (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
       *)0x0) {
    piVar1 = &local_20->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      iVar3 = (*local_20->_vptr_IteratorCore[1])();
      pIVar4 = (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
                *)CONCAT44(extraout_var,iVar3);
    }
  }
  if (local_28 != (Lib *)0x0) {
    pLVar2 = local_28 + 8;
    *(int *)pLVar2 = *(int *)pLVar2 + -1;
    if (*(int *)pLVar2 == 0) {
      pIVar4 = (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
                *)(**(code **)(*(long *)local_28 + 8))();
    }
  }
  if (i1._core !=
      (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
       *)0x0) {
    piVar1 = &(i1._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      iVar3 = (*(i1._core)->_vptr_IteratorCore[1])(i1._core);
      pIVar4 = (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
                *)CONCAT44(extraout_var_00,iVar3);
    }
    piVar1 = &(i1._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      iVar3 = (*(i1._core)->_vptr_IteratorCore[1])(i1._core);
      pIVar4 = (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
                *)CONCAT44(extraout_var_01,iVar3);
    }
  }
  if (this != (Lib *)0x0) {
    pLVar2 = this + 8;
    *(int *)pLVar2 = *(int *)pLVar2 + -1;
    if (*(int *)pLVar2 == 0) {
      pIVar4 = (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
                *)(**(code **)(*(long *)this + 8))(this);
    }
  }
  return pIVar4;
}

Assistant:

static auto concatIters(I1 i1, I2 i2, Is... is) 
{ return iterTraits(CatIterator<I1, decltype(concatIters(std::move(i2), std::move(is)...))>(std::move(i1), concatIters(std::move(i2), std::move(is)...))); }